

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>
          (RecyclableObject *arr,ScriptContext *scriptContext)

{
  code *pcVar1;
  JavascriptString *obj;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  TypedArrayBase *pTVar5;
  Var aValue;
  undefined4 *puVar6;
  anon_class_48_6_399da0b0 local_c0;
  anon_class_24_3_633237ca local_90;
  ScriptContext *local_78;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  JavascriptString *res;
  RecyclableObject *arr_local;
  ScriptContext *scriptContext_local;
  bool pushedObject;
  uint32 length;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  res = (JavascriptString *)arr;
  arr_local = (RecyclableObject *)scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,arr);
  obj = res;
  scriptContext_local._4_4_ = 0;
  bVar2 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(&res->super_RecyclableObject);
  if (bVar2) {
    pTVar5 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(&obj->super_RecyclableObject);
  }
  else {
    pTVar5 = (TypedArrayBase *)0x0;
  }
  if (pTVar5 == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_78 = (ScriptContext *)arr_local;
    aValue = JavascriptOperators::OP_GetLength(res,(ScriptContext *)arr_local);
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00ba4d9d;
      *puVar6 = 0;
    }
    if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) {
LAB_00ba4d9d:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
    else {
      uVar3 = JavascriptConversion::ToUInt32_Full(aValue,local_78);
      aValue = (Var)(ulong)uVar3;
    }
    scriptContext_local._4_4_ = (Type)aValue;
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    *(bool *)((long)local_70 + 0x108) = true;
  }
  else {
    scriptContext_local._4_4_ = (pTVar5->super_ArrayBufferParent).super_ArrayObject.length;
  }
  if ((scriptContext_local._4_4_ == 0) ||
     (BVar4 = ScriptContext::CheckObject((ScriptContext *)arr_local,res), BVar4 != 0)) {
    jsReentLock._24_8_ =
         JavascriptLibrary::GetEmptyString((JavascriptLibrary *)(arr_local->type).ptr);
  }
  else {
    jsReentLock._24_8_ =
         JavascriptLibrary::GetEmptyString((JavascriptLibrary *)(arr_local->type).ptr);
    local_c0.res = (JavascriptString **)&jsReentLock.m_savedNoJsReentrancy;
    local_c0.pushedObject = (bool *)((long)&scriptContext_local + 3);
    scriptContext_local._3_1_ = 0;
    local_c0.scriptContext = (ScriptContext **)&arr_local;
    local_c0.arr = (RecyclableObject **)&res;
    local_c0.jsReentLock = (JsReentLock *)local_70;
    local_c0.length = (uint32 *)((long)&scriptContext_local + 4);
    local_90.pushedObject = local_c0.pushedObject;
    local_90.scriptContext = local_c0.scriptContext;
    local_90.arr = (JavascriptArray **)local_c0.arr;
    TryFinally<Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda()_1_,Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda(bool)_1_>
              (&local_c0,&local_90);
    if (jsReentLock._24_8_ == 0) {
      jsReentLock._24_8_ =
           JavascriptLibrary::GetEmptyString((JavascriptLibrary *)(arr_local->type).ptr);
    }
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (JavascriptString *)jsReentLock._24_8_;
}

Assistant:

JavascriptString* JavascriptArray::ToLocaleString(T* arr, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = 0;
        TypedArrayBase * typedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(static_cast<RecyclableObject*>(arr));
        if (typedArray)
        {
            // For a TypedArray use the actual length of the array.
            length = typedArray->GetLength();
        }
        else
        {
            //For anything else, use the "length" property if present.
            JS_REENTRANT(jsReentLock, length = ItemTrace<T>::GetLength(arr, scriptContext));
        }

        if (length == 0 || scriptContext->CheckObject(arr))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        JavascriptString* res = scriptContext->GetLibrary()->GetEmptyString();
        bool pushedObject = false;

        TryFinally([&]()
        {
            scriptContext->PushObject(arr);
            pushedObject = true;

            Var element;
            JS_REENTRANT(jsReentLock, BOOL gotItem = ItemTrace<T>::GetItem(arr, 0, &element, scriptContext));
            if (gotItem)
            {
                JS_REENTRANT(jsReentLock, res = JavascriptArray::ToLocaleStringHelper(element, scriptContext));
            }

            if (length > 1)
            {
                uint32 sepSize = 0;
                char16 szSeparator[Arrays::SeparatorBufferSize];

                bool hasLocaleSeparator = Arrays::GetLocaleSeparator(szSeparator, &sepSize, Arrays::SeparatorBufferSize);

                JavascriptString* separator = nullptr;

                if (hasLocaleSeparator)
                {
                    separator = JavascriptString::NewCopyBuffer(szSeparator, static_cast<charcount_t>(sepSize), scriptContext);
                }
                else
                {
                    separator = scriptContext->GetLibrary()->GetCommaDisplayString();
                }

                for (uint32 i = 1; i < length; i++)
                {
                    res = JavascriptString::Concat(res, separator);
                    JS_REENTRANT(jsReentLock, gotItem = ItemTrace<T>::GetItem(arr, i, &element, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, res = JavascriptString::Concat(res, JavascriptArray::ToLocaleStringHelper(element, scriptContext)));
                    }
                }
            }
        },
        [&](bool/*hasException*/)
        {
            if (pushedObject)
            {
                Var top = scriptContext->PopObject();
                AssertMsg(top == arr, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }